

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O1

EdwardsPoint * ecc_edwards_point_new_from_y(EdwardsCurve *ec,mp_int *yorig,uint desired_x_parity)

{
  MontyContext *mc;
  uint uVar1;
  mp_int *pmVar2;
  mp_int *pmVar3;
  mp_int *pmVar4;
  mp_int *x;
  mp_int *x_00;
  EdwardsPoint *pEVar5;
  uint success;
  uint local_4c;
  mp_int *local_48;
  mp_int *local_40;
  mp_int *local_38;
  
  if (ec->sc != (ModsqrtContext *)0x0) {
    local_48 = monty_import(ec->mc,yorig);
    pmVar2 = monty_mul(ec->mc,local_48,local_48);
    local_38 = monty_mul(ec->mc,ec->d,pmVar2);
    pmVar3 = monty_sub(ec->mc,local_38,ec->a);
    mc = ec->mc;
    local_40 = pmVar3;
    pmVar4 = monty_identity(mc);
    pmVar4 = monty_sub(mc,pmVar2,pmVar4);
    pmVar3 = monty_invert(ec->mc,pmVar3);
    x = monty_mul(ec->mc,pmVar4,pmVar3);
    x_00 = monty_modsqrt(ec->sc,x,&local_4c);
    mp_free(pmVar2);
    mp_free(local_38);
    mp_free(local_40);
    mp_free(pmVar4);
    mp_free(pmVar3);
    mp_free(x);
    if (local_4c == 0) {
      mp_free(x_00);
      mp_free(local_48);
      pEVar5 = (EdwardsPoint *)0x0;
    }
    else {
      pmVar2 = monty_export(ec->mc,x_00);
      uVar1 = mp_get_bit(pmVar2,0);
      mp_sub_into(pmVar2,ec->p,x_00);
      mp_select_into(x_00,x_00,pmVar2,(desired_x_parity ^ uVar1) & 1);
      mp_free(pmVar2);
      pEVar5 = ecc_edwards_point_new_imported(ec,x_00,local_48);
    }
    return pEVar5;
  }
  __assert_fail("ec->sc",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ecc-arithmetic.c"
                ,0x3c2,
                "EdwardsPoint *ecc_edwards_point_new_from_y(EdwardsCurve *, mp_int *, unsigned int)"
               );
}

Assistant:

EdwardsPoint *ecc_edwards_point_new_from_y(
    EdwardsCurve *ec, mp_int *yorig, unsigned desired_x_parity)
{
    assert(ec->sc);

    /*
     * The curve equation is ax^2 + y^2 = 1 + dx^2y^2, which
     * rearranges to x^2(dy^2-a) = y^2-1. So we compute
     * (y^2-1)/(dy^2-a) and take its square root.
     */
    unsigned success;

    mp_int *y = monty_import(ec->mc, yorig);
    mp_int *y2 = monty_mul(ec->mc, y, y);
    mp_int *dy2 = monty_mul(ec->mc, ec->d, y2);
    mp_int *dy2ma = monty_sub(ec->mc, dy2, ec->a);
    mp_int *y2m1 = monty_sub(ec->mc, y2, monty_identity(ec->mc));
    mp_int *recip_denominator = monty_invert(ec->mc, dy2ma);
    mp_int *radicand = monty_mul(ec->mc, y2m1, recip_denominator);
    mp_int *x = monty_modsqrt(ec->sc, radicand, &success);
    mp_free(y2);
    mp_free(dy2);
    mp_free(dy2ma);
    mp_free(y2m1);
    mp_free(recip_denominator);
    mp_free(radicand);

    if (!success) {
        /* Failure! x^2 worked out to be a number that has no square
         * root mod p. In this situation there's no point in trying to
         * be time-constant, since the protocol sequence is going to
         * diverge anyway when we complain to whoever gave us this
         * bogus value. */
        mp_free(x);
        mp_free(y);
        return NULL;
    }

    /*
     * Choose whichever of x and p-x has the specified parity (of its
     * lowest positive residue mod p).
     */
    mp_int *tmp = monty_export(ec->mc, x);
    unsigned flip = (mp_get_bit(tmp, 0) ^ desired_x_parity) & 1;
    mp_sub_into(tmp, ec->p, x);
    mp_select_into(x, x, tmp, flip);
    mp_free(tmp);

    return ecc_edwards_point_new_imported(ec, x, y);
}